

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.c
# Opt level: O2

void TestSuite_Scanner(void)

{
  _Bool _Var1;
  sysbvm_tokenKind_t sVar2;
  int iVar3;
  sysbvm_tuple_t sVar4;
  size_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t sVar7;
  char *__format;
  char *pcVar8;
  
  sysbvm_test_currentTestCaseName = "EmptyString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- EmptyString...");
  TuuvmCore_initialize();
  __format = "";
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:12: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "SingleLineComment";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- SingleLineComment...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"## Single line comment","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:18: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "MultiLineComment";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MultiLineComment...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString
                    (sysbvm_test_context,"#*\n* Multi line comment\n*\n*#","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 0) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:24: Obtained value is not equal to 0"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Identifier";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Identifier...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"helloWorld1234","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:30: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:31: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"helloWorld1234");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:32: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"helloWorld1234\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedIdentifier";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedIdentifier...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::helloWorld1234","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:38: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:39: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::helloWorld1234");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:40: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::helloWorld1234\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedIdentifier2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedIdentifier2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString
                    (sysbvm_test_context,"Scope::SubScope::helloWorld1234","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:46: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:47: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::SubScope::helloWorld1234");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:48: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::SubScope::helloWorld1234\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Operator";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Operator...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"+","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:54: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_OPERATOR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:55: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"+");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:56: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"+\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Operator2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Operator2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"||","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:62: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_OPERATOR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:63: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"||");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:64: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"||\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedOperator";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedOperator...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::+","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:70: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_OPERATOR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:71: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::+");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:72: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::+\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedOperator2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedOperator2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::SubScope::+","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:78: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_OPERATOR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:79: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::SubScope::+");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:80: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::SubScope::+\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Keyword";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Keyword...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"test:","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:86: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_KEYWORD) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:87: Obtained value is not equal to SYSBVM_TOKEN_KIND_KEYWORD"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"test:");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:88: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"test:\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedKeyword";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedKeyword...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::test:","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:94: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_KEYWORD) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:95: Obtained value is not equal to SYSBVM_TOKEN_KIND_KEYWORD"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::test:");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:96: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::test:\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "MultiKeyword";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MultiKeyword...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"test:second:","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:102: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_MULTI_KEYWORD) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:103: Obtained value is not equal to SYSBVM_TOKEN_KIND_MULTI_KEYWORD"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"test:second:");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:104: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"test:second:\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "ScopedMultiKeyword";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedMultiKeyword...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::test:second:","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:110: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_MULTI_KEYWORD) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:111: Obtained value is not equal to SYSBVM_TOKEN_KIND_MULTI_KEYWORD"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::test:second:");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:112: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::test:second:\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "IdentifierSymbol";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IdentifierSymbol...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"#helloWorld1234","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:118: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SYMBOL) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:119: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"helloWorld1234");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:120: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"helloWorld1234\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "IdentifierSymbol2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IdentifierSymbol2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"#Scope::helloWorld1234","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:126: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SYMBOL) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:127: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::helloWorld1234");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:128: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::helloWorld1234\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "OperatorSymbol";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- OperatorSymbol...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"#+","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:134: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SYMBOL) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:135: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"+");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:136: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"+\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "OperatorSymbol2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- OperatorSymbol2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"#Scope::+","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:142: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SYMBOL) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:143: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::+");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:144: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::+\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Integer";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Integer...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"12345","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:150: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar4);
  if (sVar2 != SYSBVM_TOKEN_KIND_INTEGER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:151: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Integer2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Integer2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"12_345","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:158: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar4);
  if (sVar2 != SYSBVM_TOKEN_KIND_INTEGER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:159: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "IntegerWithRadix";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IntegerWithRadix...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"16rFF00","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:165: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar4);
  if (sVar2 != SYSBVM_TOKEN_KIND_INTEGER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:166: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "IntegerWithRadix2";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IntegerWithRadix2...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"16rFF_00","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:172: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar4);
  if (sVar2 != SYSBVM_TOKEN_KIND_INTEGER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:173: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Float";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Float...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"12345.0","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:179: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar4);
  if (sVar2 != SYSBVM_TOKEN_KIND_FLOAT) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:180: Obtained value is not equal to SYSBVM_TOKEN_KIND_FLOAT"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Character";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Character...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"\'T\'","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:186: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_CHARACTER) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:187: Obtained value is not equal to SYSBVM_TOKEN_KIND_CHARACTER"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  if ((sVar4 & 0xf) == 0) {
    iVar3 = *(int *)(sVar4 + 0x10);
  }
  else {
    iVar3 = (int)(sVar4 >> 4);
  }
  if (iVar3 != 0x54) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:188: Obtained value is not equal to \'T\'"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "String";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- String...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString(sysbvm_test_context,"\"Hello \\\"World\\r\\n\"","test","tlisp")
  ;
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:194: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_STRING) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:195: Obtained value is not equal to SYSBVM_TOKEN_KIND_STRING"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_string_createWithCString(sysbvm_test_context,"Hello \"World\r\n");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  _Var1 = sysbvm_string_equals(sVar6,sVar4);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:196: Assertion failure: sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, \"Hello \\\"World\\r\\n\"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)))"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "StringSymbol";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- StringSymbol...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString
                    (sysbvm_test_context,"#\"Hello \\\"World\\r\\n\"","test","tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:202: Obtained value is not equal to 1"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SYMBOL) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:203: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_string_createWithCString(sysbvm_test_context,"Hello \"World\r\n");
  sVar4 = sysbvm_arraySlice_at(sVar4,0);
  sVar4 = sysbvm_token_getValue(sVar4);
  _Var1 = sysbvm_string_equals(sVar6,sVar4);
  if (!_Var1) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:204: Assertion failure: sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, \"Hello \\\"World\\r\\n\"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)))"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar8 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar8 = " Success\n";
  }
  printf(pcVar8);
  sysbvm_test_currentHasError = 0;
  sysbvm_test_currentTestCaseName = "Delimiters";
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Delimiters...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_scanner_scanCString
                    (sysbvm_test_context,"() [] {} : :: `\' `` `, `@ | .. ... ; * < >","test",
                     "tlisp");
  sVar5 = sysbvm_arraySlice_getSize(sVar4);
  if (sVar5 != 0x14) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:210: Obtained value is not equal to 20"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_LPARENT) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:212: Obtained value is not equal to SYSBVM_TOKEN_KIND_LPARENT"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"(");
  sVar7 = sysbvm_arraySlice_at(sVar4,0);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:213: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"(\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,1);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_RPARENT) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:215: Obtained value is not equal to SYSBVM_TOKEN_KIND_RPARENT"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,")");
  sVar7 = sysbvm_arraySlice_at(sVar4,1);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:216: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \")\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,2);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_LBRACKET) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:218: Obtained value is not equal to SYSBVM_TOKEN_KIND_LBRACKET"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"[");
  sVar7 = sysbvm_arraySlice_at(sVar4,2);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:219: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"[\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,3);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_RBRACKET) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:221: Obtained value is not equal to SYSBVM_TOKEN_KIND_RBRACKET"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"]");
  sVar7 = sysbvm_arraySlice_at(sVar4,3);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:222: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"]\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,4);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_LCBRACKET) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:224: Obtained value is not equal to SYSBVM_TOKEN_KIND_LCBRACKET"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"{");
  sVar7 = sysbvm_arraySlice_at(sVar4,4);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:225: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"{\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,5);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_RCBRACKET) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:227: Obtained value is not equal to SYSBVM_TOKEN_KIND_RCBRACKET"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"}");
  sVar7 = sysbvm_arraySlice_at(sVar4,5);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:228: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"}\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,6);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_COLON) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:230: Obtained value is not equal to SYSBVM_TOKEN_KIND_COLON"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,":");
  sVar7 = sysbvm_arraySlice_at(sVar4,6);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:231: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \":\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,7);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_COLON_COLON) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:233: Obtained value is not equal to SYSBVM_TOKEN_KIND_COLON_COLON"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"::");
  sVar7 = sysbvm_arraySlice_at(sVar4,7);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:234: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"::\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,8);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_QUOTE) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:236: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUOTE"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`\'");
  sVar7 = sysbvm_arraySlice_at(sVar4,8);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:237: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`\'\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,9);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_QUASI_QUOTE) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:239: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUASI_QUOTE"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"``");
  sVar7 = sysbvm_arraySlice_at(sVar4,9);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:240: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"``\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,10);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_QUASI_UNQUOTE) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:242: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUASI_UNQUOTE"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`,");
  sVar7 = sysbvm_arraySlice_at(sVar4,10);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:243: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`,\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0xb);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SPLICE) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:245: Obtained value is not equal to SYSBVM_TOKEN_KIND_SPLICE"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`@");
  sVar7 = sysbvm_arraySlice_at(sVar4,0xb);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:246: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`@\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0xc);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_BAR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:248: Obtained value is not equal to SYSBVM_TOKEN_KIND_BAR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"|");
  sVar7 = sysbvm_arraySlice_at(sVar4,0xc);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:249: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"|\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0xd);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_DOT) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:251: Obtained value is not equal to SYSBVM_TOKEN_KIND_DOT"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,".");
  sVar7 = sysbvm_arraySlice_at(sVar4,0xd);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:252: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \".\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0xe);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_DOT) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:254: Obtained value is not equal to SYSBVM_TOKEN_KIND_DOT"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,".");
  sVar7 = sysbvm_arraySlice_at(sVar4,0xe);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:255: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \".\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0xf);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_ELLIPSIS) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:257: Obtained value is not equal to SYSBVM_TOKEN_KIND_ELLIPSIS"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"...");
  sVar7 = sysbvm_arraySlice_at(sVar4,0xf);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:258: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"...\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0x10);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_SEMICOLON) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:260: Obtained value is not equal to SYSBVM_TOKEN_KIND_SEMICOLON"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,";");
  sVar7 = sysbvm_arraySlice_at(sVar4,0x10);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:261: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \";\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0x11);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_STAR) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:263: Obtained value is not equal to SYSBVM_TOKEN_KIND_STAR"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"*");
  sVar7 = sysbvm_arraySlice_at(sVar4,0x11);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:264: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"*\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0x12);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_LESS_THAN) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:266: Obtained value is not equal to SYSBVM_TOKEN_KIND_LESS_THAN"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,"<");
  sVar7 = sysbvm_arraySlice_at(sVar4,0x12);
  sVar7 = sysbvm_token_getValue(sVar7);
  if (sVar6 != sVar7) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:267: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"<\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_arraySlice_at(sVar4,0x13);
  sVar2 = sysbvm_token_getKind(sVar6);
  if (sVar2 != SYSBVM_TOKEN_KIND_GREATER_THAN) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:269: Obtained value is not equal to SYSBVM_TOKEN_KIND_GREATER_THAN"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar6 = sysbvm_symbol_internWithCString(sysbvm_test_context,">");
  sVar4 = sysbvm_arraySlice_at(sVar4,0x13);
  sVar4 = sysbvm_token_getValue(sVar4);
  if (sVar6 != sVar4) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:270: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \">\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  if (sysbvm_test_currentHasError == 0) {
    __format = " Success\n";
  }
  printf(__format);
  return;
}

Assistant:

TEST_SUITE(Scanner)
{
    TEST_CASE_WITH_FIXTURE(EmptyString, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(SingleLineComment, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "## Single line comment", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(MultiLineComment, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#*\n* Multi line comment\n*\n*#", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(Identifier, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedIdentifier, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedIdentifier2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::SubScope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::SubScope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Operator, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Operator2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "||", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "||"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedOperator, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedOperator2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::SubScope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::SubScope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Keyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "test:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "test:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::test:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::test:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(MultiKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "test:second:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_MULTI_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "test:second:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedMultiKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::test:second:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_MULTI_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::test:second:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IdentifierSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IdentifierSymbol2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#Scope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(OperatorSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(OperatorSymbol2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#Scope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Integer, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12345", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }


    TEST_CASE_WITH_FIXTURE(Integer2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12_345", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IntegerWithRadix, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "16rFF00", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IntegerWithRadix2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "16rFF_00", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Float, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12345.0", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_FLOAT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Character, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "'T'", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_CHARACTER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS('T', sysbvm_tuple_char32_decode(sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(String, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "\"Hello \\\"World\\r\\n\"", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_STRING, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT(sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, "Hello \"World\r\n"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(StringSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#\"Hello \\\"World\\r\\n\"", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT(sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, "Hello \"World\r\n"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(Delimiters, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "() [] {} : :: `' `` `, `@ | .. ... ; * < >", "test", "tlisp");
        TEST_ASSERT_EQUALS(20, sysbvm_arraySlice_getSize(tokenList));
        
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LPARENT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "("), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RPARENT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 1)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ")"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 1)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 2)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "["), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 2)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 3)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "]"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 3)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LCBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 4)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "{"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 4)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RCBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 5)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "}"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 5)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_COLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 6)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ":"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 6)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_COLON_COLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 7)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "::"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 7)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 8)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`'"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 8)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUASI_QUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 9)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "``"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 9)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUASI_UNQUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 10)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`,"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 10)));
        
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SPLICE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 11)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`@"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 11)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_BAR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 12)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "|"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 12)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_DOT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 13)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 13)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_DOT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 14)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 14)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_ELLIPSIS, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 15)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "..."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 15)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SEMICOLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 16)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ";"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 16)));
 
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_STAR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 17)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "*"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 17)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LESS_THAN, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 18)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "<"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 18)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_GREATER_THAN, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 19)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ">"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 19)));
    }
}